

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_next(mtar_t *tar)

{
  size_t sVar1;
  undefined1 local_108 [8];
  mtar_header_t h;
  size_t n;
  int err;
  mtar_t *tar_local;
  
  tar_local._4_4_ = mtar_read_header(tar,(mtar_header_t *)local_108);
  if (tar_local._4_4_ == 0) {
    sVar1 = mtar_round_up(h._0_8_,0x200);
    h.linkname._92_8_ = sVar1 + 0x200;
    tar_local._4_4_ = mtar_seek(tar,tar->pos + h.linkname._92_8_);
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_next(mtar_t *tar) {
  int err;
  size_t n;
  mtar_header_t h;
  /* Load header */
  err = mtar_read_header(tar, &h);
  if (err) {
    return err;
  }
  /* Seek to next record */
  n = mtar_round_up(h.size, 512) + sizeof(mtar_raw_header_t);
  return mtar_seek(tar, tar->pos + n);
}